

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

ssize_t __thiscall HighsTimer::read(HighsTimer *this,int __fd,void *__buf,size_t __nbytes)

{
  const_reference pvVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  double wall_time;
  double read_time;
  string clock_name;
  HighsTimer *in_stack_ffffffffffffffb0;
  string local_30 [36];
  int local_c;
  HighsTimer *local_8;
  
  local_c = __fd;
  local_8 = this;
  if (__fd == -0x2e) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->clock_names,0xffffffffffffffd2);
    std::__cxx11::string::string(local_30,(string *)pvVar1);
    uVar2 = std::__cxx11::string::c_str();
    printf("HighsTimer: reading clock %d: %s\n",0xffffffd2,uVar2);
    std::__cxx11::string::~string(local_30);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->clock_start,(long)local_c);
  if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->clock_time,(long)local_c);
  }
  else {
    getWallTime(in_stack_ffffffffffffffb0);
    std::vector<double,_std::allocator<double>_>::operator[](&this->clock_time,(long)local_c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->clock_start,(long)local_c);
  }
  return (ssize_t)pvVar3;
}

Assistant:

double read(const HighsInt i_clock = 0  //!< Index of the clock to be read
  ) const {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    if (i_clock == check_clock) {
      std::string clock_name = this->clock_names[check_clock];
      printf("HighsTimer: reading clock %d: %s\n", int(check_clock),
             clock_name.c_str());
    }
    double read_time;
    if (clock_start[i_clock] < 0) {
      // The clock's been started, so find the current time
      double wall_time = getWallTime();
      read_time = clock_time[i_clock] + wall_time + clock_start[i_clock];
    } else {
      // The clock is currently stopped, so read the current time
      read_time = clock_time[i_clock];
    }
    return read_time;
  }